

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  undefined4 uVar19;
  RTCRayQueryContext *pRVar20;
  undefined8 uVar21;
  Scene *pSVar22;
  Geometry *pGVar23;
  RTCFilterFunctionN p_Var24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  RayQueryContext *pRVar33;
  int iVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  RayQueryContext *pRVar40;
  RTCRayQueryContext *pRVar41;
  ulong uVar42;
  RayQueryContext *pRVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  float fVar68;
  float fVar69;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar70;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar67;
  float fVar71;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar81;
  undefined1 auVar82 [16];
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar88;
  float fVar93;
  float fVar95;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar94;
  uint uVar96;
  float fVar97;
  uint uVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar114;
  float fVar115;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar127 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  vbool<4> valid;
  undefined1 local_1238 [16];
  undefined1 (*local_1228) [16];
  ulong local_1220;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  float local_1158 [4];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pRVar43 = (RayQueryContext *)(stack + 1);
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar87 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar97 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar157 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar141 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar146 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar151 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar163 = fVar141 * 0.99999964;
  fVar117 = fVar146 * 0.99999964;
  fVar158 = fVar151 * 0.99999964;
  fVar141 = fVar141 * 1.0000004;
  fVar146 = fVar146 * 1.0000004;
  fVar151 = fVar151 * 1.0000004;
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar34 = (tray->tnear).field_0.i[k];
  auVar124._4_4_ = iVar34;
  auVar124._0_4_ = iVar34;
  auVar124._8_4_ = iVar34;
  auVar124._12_4_ = iVar34;
  iVar34 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar34;
  auVar58._0_4_ = iVar34;
  auVar58._8_4_ = iVar34;
  auVar58._12_4_ = iVar34;
  local_1228 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_10a8 = fVar87;
  fStack_10a4 = fVar87;
  fStack_10a0 = fVar87;
  fStack_109c = fVar87;
  local_10b8 = fVar97;
  fStack_10b4 = fVar97;
  fStack_10b0 = fVar97;
  fStack_10ac = fVar97;
  local_10c8 = fVar157;
  fStack_10c4 = fVar157;
  fStack_10c0 = fVar157;
  fStack_10bc = fVar157;
  local_10d8 = fVar141;
  fStack_10d4 = fVar141;
  fStack_10d0 = fVar141;
  fStack_10cc = fVar141;
  local_10e8 = fVar146;
  fStack_10e4 = fVar146;
  fStack_10e0 = fVar146;
  fStack_10dc = fVar146;
  local_10f8 = fVar151;
  fStack_10f4 = fVar151;
  fStack_10f0 = fVar151;
  fStack_10ec = fVar151;
  local_1108 = fVar158;
  fStack_1104 = fVar158;
  fStack_1100 = fVar158;
  fStack_10fc = fVar158;
  local_1118 = fVar163;
  fStack_1114 = fVar163;
  fStack_1110 = fVar163;
  fStack_110c = fVar163;
  pRVar40 = (RayQueryContext *)k;
  fVar68 = fVar141;
  fVar69 = fVar141;
  fVar70 = fVar141;
  fVar71 = fVar146;
  fVar77 = fVar146;
  fVar78 = fVar146;
  fVar93 = fVar158;
  fVar95 = fVar158;
  fVar99 = fVar158;
  fVar103 = fVar163;
  fVar104 = fVar163;
  fVar105 = fVar163;
  fVar106 = fVar87;
  fVar107 = fVar87;
  fVar108 = fVar87;
  fVar109 = fVar97;
  fVar114 = fVar97;
  fVar115 = fVar97;
  fVar116 = fVar157;
  fVar118 = fVar157;
  fVar123 = fVar157;
  fVar126 = fVar151;
  fVar128 = fVar151;
  fVar129 = fVar151;
LAB_006f94e9:
  do {
    do {
      if (pRVar43 == (RayQueryContext *)stack) {
        return;
      }
      pRVar33 = pRVar43 + -1;
      pRVar43 = (RayQueryContext *)&pRVar43[-1].user;
    } while (*(float *)(ray + k * 4 + 0x80) <= *(float *)&pRVar33->args &&
             *(float *)&pRVar33->args != *(float *)(ray + k * 4 + 0x80));
    pRVar41 = *(RTCRayQueryContext **)pRVar43;
    while (((ulong)pRVar41 & 8) == 0) {
      uVar37 = (ulong)pRVar41 & 0xfffffffffffffff0;
      fVar130 = *(float *)(ray + k * 4 + 0x70);
      pfVar8 = (float *)(uVar37 + 0x80 + uVar45);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar45);
      auVar79._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar87) * fVar163;
      auVar79._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar106) * fVar103;
      auVar79._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar107) * fVar104;
      auVar79._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar108) * fVar105;
      auVar79 = maxps(auVar124,auVar79);
      pfVar8 = (float *)(uVar37 + 0x80 + uVar47);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar47);
      auVar89._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar97) * fVar117;
      auVar89._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar109) * fVar117;
      auVar89._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar114) * fVar117;
      auVar89._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar115) * fVar117;
      pfVar8 = (float *)(uVar37 + 0x80 + uVar46);
      pfVar1 = (float *)(uVar37 + 0x20 + uVar46);
      auVar102._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar157) * fVar158;
      auVar102._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar116) * fVar93;
      auVar102._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar118) * fVar95;
      auVar102._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar123) * fVar99;
      auVar89 = maxps(auVar89,auVar102);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar79,auVar89);
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar45 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar45 ^ 0x10));
      auVar112._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar87) * fVar141;
      auVar112._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar106) * fVar68;
      auVar112._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar107) * fVar69;
      auVar112._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar108) * fVar70;
      auVar79 = minps(auVar58,auVar112);
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar47 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar47 ^ 0x10));
      auVar120._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar97) * fVar146;
      auVar120._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar109) * fVar71;
      auVar120._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar114) * fVar77;
      auVar120._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar115) * fVar78;
      pfVar8 = (float *)(uVar37 + 0x80 + (uVar46 ^ 0x10));
      pfVar1 = (float *)(uVar37 + 0x20 + (uVar46 ^ 0x10));
      auVar110._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar157) * fVar151;
      auVar110._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar116) * fVar126;
      auVar110._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar118) * fVar128;
      auVar110._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar123) * fVar129;
      auVar89 = minps(auVar120,auVar110);
      auVar79 = minps(auVar79,auVar89);
      if (((uint)pRVar41 & 7) == 6) {
        bVar25 = (fVar130 < *(float *)(uVar37 + 0xf0) && *(float *)(uVar37 + 0xe0) <= fVar130) &&
                 tNear.field_0._0_4_ <= auVar79._0_4_;
        bVar26 = (fVar130 < *(float *)(uVar37 + 0xf4) && *(float *)(uVar37 + 0xe4) <= fVar130) &&
                 tNear.field_0._4_4_ <= auVar79._4_4_;
        bVar27 = (fVar130 < *(float *)(uVar37 + 0xf8) && *(float *)(uVar37 + 0xe8) <= fVar130) &&
                 tNear.field_0._8_4_ <= auVar79._8_4_;
        bVar28 = (fVar130 < *(float *)(uVar37 + 0xfc) && *(float *)(uVar37 + 0xec) <= fVar130) &&
                 tNear.field_0._12_4_ <= auVar79._12_4_;
      }
      else {
        bVar25 = tNear.field_0._0_4_ <= auVar79._0_4_;
        bVar26 = tNear.field_0._4_4_ <= auVar79._4_4_;
        bVar27 = tNear.field_0._8_4_ <= auVar79._8_4_;
        bVar28 = tNear.field_0._12_4_ <= auVar79._12_4_;
      }
      auVar48._0_4_ = (uint)bVar25 * -0x80000000;
      auVar48._4_4_ = (uint)bVar26 * -0x80000000;
      auVar48._8_4_ = (uint)bVar27 * -0x80000000;
      auVar48._12_4_ = (uint)bVar28 * -0x80000000;
      uVar39 = movmskps((int)pRVar40,auVar48);
      pRVar40 = (RayQueryContext *)(ulong)uVar39;
      if (uVar39 == 0) goto LAB_006f94e9;
      pRVar40 = (RayQueryContext *)0x0;
      if ((byte)uVar39 != 0) {
        for (; ((byte)uVar39 >> (long)pRVar40 & 1) == 0;
            pRVar40 = (RayQueryContext *)((long)&((NodeRefPtr<4> *)&pRVar40->scene)->ptr + 1)) {
        }
      }
      pRVar41 = *(RTCRayQueryContext **)(uVar37 + (long)pRVar40 * 8);
      uVar39 = (uVar39 & 0xff) - 1 & uVar39 & 0xff;
      if (uVar39 != 0) {
        uVar88 = tNear.field_0.i[(long)pRVar40];
        lVar38 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
          }
        }
        pRVar20 = *(RTCRayQueryContext **)(uVar37 + lVar38 * 8);
        uVar94 = tNear.field_0.i[lVar38];
        uVar39 = uVar39 - 1 & uVar39;
        pRVar40 = (RayQueryContext *)(ulong)uVar39;
        if (uVar39 == 0) {
          pRVar40 = pRVar43;
          if (uVar88 < uVar94) {
            ((NodeRefPtr<4> *)&pRVar43->scene)->ptr = (size_t)pRVar20;
            *(uint *)&pRVar43->user = uVar94;
            pRVar43 = (RayQueryContext *)&pRVar43->args;
          }
          else {
            ((NodeRefPtr<4> *)&pRVar43->scene)->ptr = (size_t)pRVar41;
            *(uint *)&pRVar43->user = uVar88;
            pRVar41 = pRVar20;
            pRVar43 = (RayQueryContext *)&pRVar43->args;
          }
        }
        else {
          auVar80._8_4_ = uVar88;
          auVar80._0_8_ = pRVar41;
          auVar80._12_4_ = 0;
          auVar100._8_4_ = uVar94;
          auVar100._0_8_ = pRVar20;
          auVar100._12_4_ = 0;
          lVar38 = 0;
          if (pRVar40 != (RayQueryContext *)0x0) {
            for (; (uVar39 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
            }
          }
          uVar21 = *(undefined8 *)(uVar37 + lVar38 * 8);
          iVar34 = tNear.field_0.i[lVar38];
          auVar90._8_4_ = iVar34;
          auVar90._0_8_ = uVar21;
          auVar90._12_4_ = 0;
          auVar49._8_4_ = -(uint)((int)uVar88 < (int)uVar94);
          uVar39 = uVar39 - 1 & uVar39;
          if (uVar39 == 0) {
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            auVar111._8_4_ = uVar94;
            auVar111._0_8_ = pRVar20;
            auVar111._12_4_ = 0;
            auVar89 = blendvps(auVar111,auVar80,auVar49);
            auVar79 = blendvps(auVar80,auVar100,auVar49);
            auVar50._8_4_ = -(uint)(auVar89._8_4_ < iVar34);
            auVar50._4_4_ = auVar50._8_4_;
            auVar50._0_4_ = auVar50._8_4_;
            auVar50._12_4_ = auVar50._8_4_;
            auVar101._8_4_ = iVar34;
            auVar101._0_8_ = uVar21;
            auVar101._12_4_ = 0;
            auVar102 = blendvps(auVar101,auVar89,auVar50);
            auVar112 = blendvps(auVar89,auVar90,auVar50);
            auVar51._8_4_ = -(uint)(auVar79._8_4_ < auVar112._8_4_);
            auVar51._4_4_ = auVar51._8_4_;
            auVar51._0_4_ = auVar51._8_4_;
            auVar51._12_4_ = auVar51._8_4_;
            auVar89 = blendvps(auVar112,auVar79,auVar51);
            SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar112,auVar51);
            *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar43 = SVar81;
            *(undefined1 (*) [16])&pRVar43->args = auVar89;
            pRVar41 = auVar102._0_8_;
            pRVar43 = (RayQueryContext *)&pRVar43[1].user;
          }
          else {
            pRVar40 = (RayQueryContext *)0x0;
            if (uVar39 != 0) {
              for (; (uVar39 >> (long)pRVar40 & 1) == 0;
                  pRVar40 = (RayQueryContext *)((long)&((NodeRefPtr<4> *)&pRVar40->scene)->ptr + 1))
              {
              }
            }
            auVar52._4_4_ = auVar49._8_4_;
            auVar52._0_4_ = auVar49._8_4_;
            auVar52._8_4_ = auVar49._8_4_;
            auVar52._12_4_ = auVar49._8_4_;
            auVar112 = blendvps(auVar100,auVar80,auVar52);
            auVar79 = blendvps(auVar80,auVar100,auVar52);
            auVar119._8_4_ = tNear.field_0.i[(long)pRVar40];
            auVar119._0_8_ = *(undefined8 *)(uVar37 + (long)pRVar40 * 8);
            auVar119._12_4_ = 0;
            auVar53._8_4_ = -(uint)(iVar34 < tNear.field_0.i[(long)pRVar40]);
            auVar53._4_4_ = auVar53._8_4_;
            auVar53._0_4_ = auVar53._8_4_;
            auVar53._12_4_ = auVar53._8_4_;
            auVar102 = blendvps(auVar119,auVar90,auVar53);
            auVar89 = blendvps(auVar90,auVar119,auVar53);
            auVar54._8_4_ = -(uint)(auVar79._8_4_ < auVar89._8_4_);
            auVar54._4_4_ = auVar54._8_4_;
            auVar54._0_4_ = auVar54._8_4_;
            auVar54._12_4_ = auVar54._8_4_;
            auVar120 = blendvps(auVar89,auVar79,auVar54);
            SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar89,auVar54);
            auVar55._8_4_ = -(uint)(auVar112._8_4_ < auVar102._8_4_);
            auVar55._4_4_ = auVar55._8_4_;
            auVar55._0_4_ = auVar55._8_4_;
            auVar55._12_4_ = auVar55._8_4_;
            auVar79 = blendvps(auVar102,auVar112,auVar55);
            auVar102 = blendvps(auVar112,auVar102,auVar55);
            auVar56._8_4_ = -(uint)(auVar102._8_4_ < auVar120._8_4_);
            auVar56._4_4_ = auVar56._8_4_;
            auVar56._0_4_ = auVar56._8_4_;
            auVar56._12_4_ = auVar56._8_4_;
            auVar89 = blendvps(auVar120,auVar102,auVar56);
            auVar102 = blendvps(auVar102,auVar120,auVar56);
            *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar43 = SVar81;
            *(undefined1 (*) [16])&pRVar43->args = auVar102;
            pRVar43[1].user = (RTCRayQueryContext *)auVar89._0_8_;
            pRVar43[1].args = (RTCIntersectArguments *)auVar89._8_8_;
            pRVar41 = auVar79._0_8_;
            pRVar43 = pRVar43 + 2;
          }
        }
      }
    }
    uVar37 = (ulong)((uint)pRVar41 & 0xf) - 8;
    uVar42 = (ulong)pRVar41 & 0xfffffffffffffff0;
    local_1220 = uVar37;
    for (uVar44 = 0; uVar44 != local_1220; uVar44 = uVar44 + 1) {
      pRVar40 = (RayQueryContext *)(uVar44 * 0x140);
      fVar87 = *(float *)(ray + k * 4 + 0x70);
      pfVar9 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40[6].scene)->ptr + uVar42);
      pfVar1 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40->scene)->ptr + uVar42);
      pfVar10 = (float *)((long)&pRVar40[6].args + uVar42);
      pfVar8 = (float *)((long)&pRVar40->args + uVar42);
      pfVar11 = (float *)((long)&pRVar40[7].user + uVar42);
      pfVar2 = (float *)((long)&pRVar40[1].user + uVar42);
      pfVar12 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40[8].scene)->ptr + uVar42);
      pfVar3 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40[2].scene)->ptr + uVar42);
      pfVar13 = (float *)((long)&pRVar40[8].args + uVar42);
      pfVar4 = (float *)((long)&pRVar40[2].args + uVar42);
      pfVar14 = (float *)((long)&pRVar40[9].user + uVar42);
      pfVar5 = (float *)((long)&pRVar40[3].user + uVar42);
      pfVar15 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40[10].scene)->ptr + uVar42);
      pfVar6 = (float *)((long)&((NodeRefPtr<4> *)&pRVar40[4].scene)->ptr + uVar42);
      pfVar16 = (float *)((long)&pRVar40[10].args + uVar42);
      pfVar7 = (float *)((long)&pRVar40[4].args + uVar42);
      pfVar17 = (float *)((long)&pRVar40[0xb].user + uVar42);
      pfVar18 = (float *)((long)&pRVar40[5].user + uVar42);
      fVar97 = *(float *)(ray + k * 4);
      fVar157 = *(float *)(ray + k * 4 + 0x10);
      fVar141 = *(float *)(ray + k * 4 + 0x20);
      local_1028 = (*pfVar9 * fVar87 + *pfVar1) - fVar97;
      fStack_1024 = (pfVar9[1] * fVar87 + pfVar1[1]) - fVar97;
      fStack_1020 = (pfVar9[2] * fVar87 + pfVar1[2]) - fVar97;
      fStack_101c = (pfVar9[3] * fVar87 + pfVar1[3]) - fVar97;
      fVar147 = (*pfVar10 * fVar87 + *pfVar8) - fVar157;
      fVar148 = (pfVar10[1] * fVar87 + pfVar8[1]) - fVar157;
      fVar149 = (pfVar10[2] * fVar87 + pfVar8[2]) - fVar157;
      fVar150 = (pfVar10[3] * fVar87 + pfVar8[3]) - fVar157;
      fVar159 = (*pfVar11 * fVar87 + *pfVar2) - fVar141;
      fVar160 = (pfVar11[1] * fVar87 + pfVar2[1]) - fVar141;
      fVar161 = (pfVar11[2] * fVar87 + pfVar2[2]) - fVar141;
      fVar162 = (pfVar11[3] * fVar87 + pfVar2[3]) - fVar141;
      fVar151 = (*pfVar12 * fVar87 + *pfVar3) - fVar97;
      fVar68 = (pfVar12[1] * fVar87 + pfVar3[1]) - fVar97;
      fVar69 = (pfVar12[2] * fVar87 + pfVar3[2]) - fVar97;
      fVar70 = (pfVar12[3] * fVar87 + pfVar3[3]) - fVar97;
      fVar109 = (*pfVar13 * fVar87 + *pfVar4) - fVar157;
      fVar114 = (pfVar13[1] * fVar87 + pfVar4[1]) - fVar157;
      fVar115 = (pfVar13[2] * fVar87 + pfVar4[2]) - fVar157;
      fVar116 = (pfVar13[3] * fVar87 + pfVar4[3]) - fVar157;
      fVar142 = (*pfVar14 * fVar87 + *pfVar5) - fVar141;
      fVar143 = (pfVar14[1] * fVar87 + pfVar5[1]) - fVar141;
      fVar144 = (pfVar14[2] * fVar87 + pfVar5[2]) - fVar141;
      fVar145 = (pfVar14[3] * fVar87 + pfVar5[3]) - fVar141;
      fVar158 = (*pfVar15 * fVar87 + *pfVar6) - fVar97;
      fVar93 = (pfVar15[1] * fVar87 + pfVar6[1]) - fVar97;
      fVar95 = (pfVar15[2] * fVar87 + pfVar6[2]) - fVar97;
      fVar97 = (pfVar15[3] * fVar87 + pfVar6[3]) - fVar97;
      fVar152 = (*pfVar16 * fVar87 + *pfVar7) - fVar157;
      fVar155 = (pfVar16[1] * fVar87 + pfVar7[1]) - fVar157;
      fVar156 = (pfVar16[2] * fVar87 + pfVar7[2]) - fVar157;
      fVar157 = (pfVar16[3] * fVar87 + pfVar7[3]) - fVar157;
      fVar71 = (fVar87 * *pfVar17 + *pfVar18) - fVar141;
      fVar77 = (fVar87 * pfVar17[1] + pfVar18[1]) - fVar141;
      fVar78 = (fVar87 * pfVar17[2] + pfVar18[2]) - fVar141;
      fVar141 = (fVar87 * pfVar17[3] + pfVar18[3]) - fVar141;
      fVar131 = fVar158 - local_1028;
      fVar133 = fVar93 - fStack_1024;
      fVar134 = fVar95 - fStack_1020;
      fVar135 = fVar97 - fStack_101c;
      local_1018 = fVar152 - fVar147;
      fStack_1014 = fVar155 - fVar148;
      fStack_1010 = fVar156 - fVar149;
      fStack_100c = fVar157 - fVar150;
      fVar136 = fVar71 - fVar159;
      fVar138 = fVar77 - fVar160;
      fVar139 = fVar78 - fVar161;
      fVar140 = fVar141 - fVar162;
      fVar87 = *(float *)(ray + k * 4 + 0x50);
      local_1038 = *(float *)(ray + k * 4 + 0x60);
      fVar146 = *(float *)(ray + k * 4 + 0x40);
      fVar118 = (local_1018 * (fVar71 + fVar159) - (fVar152 + fVar147) * fVar136) * fVar146 +
                ((fVar158 + local_1028) * fVar136 - (fVar71 + fVar159) * fVar131) * fVar87 +
                (fVar131 * (fVar152 + fVar147) - (fVar158 + local_1028) * local_1018) * local_1038;
      fVar123 = (fStack_1014 * (fVar77 + fVar160) - (fVar155 + fVar148) * fVar138) * fVar146 +
                ((fVar93 + fStack_1024) * fVar138 - (fVar77 + fVar160) * fVar133) * fVar87 +
                (fVar133 * (fVar155 + fVar148) - (fVar93 + fStack_1024) * fStack_1014) * local_1038;
      local_1088._0_8_ = CONCAT44(fVar123,fVar118);
      local_1088._8_4_ =
           (fStack_1010 * (fVar78 + fVar161) - (fVar156 + fVar149) * fVar139) * fVar146 +
           ((fVar95 + fStack_1020) * fVar139 - (fVar78 + fVar161) * fVar134) * fVar87 +
           (fVar134 * (fVar156 + fVar149) - (fVar95 + fStack_1020) * fStack_1010) * local_1038;
      local_1088._12_4_ =
           (fStack_100c * (fVar141 + fVar162) - (fVar157 + fVar150) * fVar140) * fVar146 +
           ((fVar97 + fStack_101c) * fVar140 - (fVar141 + fVar162) * fVar135) * fVar87 +
           (fVar135 * (fVar157 + fVar150) - (fVar97 + fStack_101c) * fStack_100c) * local_1038;
      fVar99 = local_1028 - fVar151;
      fVar103 = fStack_1024 - fVar68;
      fVar105 = fStack_1020 - fVar69;
      fVar107 = fStack_101c - fVar70;
      fVar126 = fVar147 - fVar109;
      fVar128 = fVar148 - fVar114;
      fVar129 = fVar149 - fVar115;
      fVar130 = fVar150 - fVar116;
      local_1048 = fVar159 - fVar142;
      fStack_1044 = fVar160 - fVar143;
      fStack_1040 = fVar161 - fVar144;
      fStack_103c = fVar162 - fVar145;
      local_1078._0_4_ =
           (fVar126 * (fVar159 + fVar142) - (fVar147 + fVar109) * local_1048) * fVar146 +
           ((local_1028 + fVar151) * local_1048 - (fVar159 + fVar142) * fVar99) * fVar87 +
           (fVar99 * (fVar147 + fVar109) - (local_1028 + fVar151) * fVar126) * local_1038;
      local_1078._4_4_ =
           (fVar128 * (fVar160 + fVar143) - (fVar148 + fVar114) * fStack_1044) * fVar146 +
           ((fStack_1024 + fVar68) * fStack_1044 - (fVar160 + fVar143) * fVar103) * fVar87 +
           (fVar103 * (fVar148 + fVar114) - (fStack_1024 + fVar68) * fVar128) * local_1038;
      local_1078._8_4_ =
           (fVar129 * (fVar161 + fVar144) - (fVar149 + fVar115) * fStack_1040) * fVar146 +
           ((fStack_1020 + fVar69) * fStack_1040 - (fVar161 + fVar144) * fVar105) * fVar87 +
           (fVar105 * (fVar149 + fVar115) - (fStack_1020 + fVar69) * fVar129) * local_1038;
      local_1078._12_4_ =
           (fVar130 * (fVar162 + fVar145) - (fVar150 + fVar116) * fStack_103c) * fVar146 +
           ((fStack_101c + fVar70) * fStack_103c - (fVar162 + fVar145) * fVar107) * fVar87 +
           (fVar107 * (fVar150 + fVar116) - (fStack_101c + fVar70) * fVar130) * local_1038;
      fVar163 = fVar151 - fVar158;
      fVar104 = fVar68 - fVar93;
      fVar106 = fVar69 - fVar95;
      fVar108 = fVar70 - fVar97;
      local_1058 = fVar109 - fVar152;
      fStack_1054 = fVar114 - fVar155;
      fStack_1050 = fVar115 - fVar156;
      fStack_104c = fVar116 - fVar157;
      local_1068 = fVar142 - fVar71;
      fStack_1064 = fVar143 - fVar77;
      fStack_1060 = fVar144 - fVar78;
      fStack_105c = fVar145 - fVar141;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      auVar82._0_4_ =
           (local_1058 * (fVar71 + fVar142) - (fVar152 + fVar109) * local_1068) * fVar146 +
           ((fVar158 + fVar151) * local_1068 - (fVar71 + fVar142) * fVar163) * fVar87 +
           (fVar163 * (fVar152 + fVar109) - (fVar158 + fVar151) * local_1058) * local_1038;
      auVar82._4_4_ =
           (fStack_1054 * (fVar77 + fVar143) - (fVar155 + fVar114) * fStack_1064) * fVar146 +
           ((fVar93 + fVar68) * fStack_1064 - (fVar77 + fVar143) * fVar104) * fVar87 +
           (fVar104 * (fVar155 + fVar114) - (fVar93 + fVar68) * fStack_1054) * local_1038;
      auVar82._8_4_ =
           (fStack_1050 * (fVar78 + fVar144) - (fVar156 + fVar115) * fStack_1060) * fVar146 +
           ((fVar95 + fVar69) * fStack_1060 - (fVar78 + fVar144) * fVar106) * fVar87 +
           (fVar106 * (fVar156 + fVar115) - (fVar95 + fVar69) * fStack_1050) * local_1038;
      auVar82._12_4_ =
           (fStack_104c * (fVar141 + fVar145) - (fVar157 + fVar116) * fStack_105c) * fVar146 +
           ((fVar97 + fVar70) * fStack_105c - (fVar141 + fVar145) * fVar108) * fVar87 +
           (fVar108 * (fVar157 + fVar116) - (fVar97 + fVar70) * fStack_104c) * local_1038;
      local_1098 = fVar118 + local_1078._0_4_ + auVar82._0_4_;
      fStack_1094 = fVar123 + local_1078._4_4_ + auVar82._4_4_;
      fStack_1090 = local_1088._8_4_ + local_1078._8_4_ + auVar82._8_4_;
      fStack_108c = local_1088._12_4_ + local_1078._12_4_ + auVar82._12_4_;
      auVar57._8_4_ = local_1088._8_4_;
      auVar57._0_8_ = local_1088._0_8_;
      auVar57._12_4_ = local_1088._12_4_;
      auVar58 = minps(auVar57,local_1078);
      auVar58 = minps(auVar58,auVar82);
      auVar153._8_4_ = local_1088._8_4_;
      auVar153._0_8_ = local_1088._0_8_;
      auVar153._12_4_ = local_1088._12_4_;
      auVar79 = maxps(auVar153,local_1078);
      auVar79 = maxps(auVar79,auVar82);
      fVar97 = ABS(local_1098) * 1.1920929e-07;
      fVar157 = ABS(fStack_1094) * 1.1920929e-07;
      fVar141 = ABS(fStack_1090) * 1.1920929e-07;
      fVar151 = ABS(fStack_108c) * 1.1920929e-07;
      auVar154._4_4_ = -(uint)(auVar79._4_4_ <= fVar157);
      auVar154._0_4_ = -(uint)(auVar79._0_4_ <= fVar97);
      auVar154._8_4_ = -(uint)(auVar79._8_4_ <= fVar141);
      auVar154._12_4_ = -(uint)(auVar79._12_4_ <= fVar151);
      auVar59._4_4_ = -(uint)(-fVar157 <= auVar58._4_4_);
      auVar59._0_4_ = -(uint)(-fVar97 <= auVar58._0_4_);
      auVar59._8_4_ = -(uint)(-fVar141 <= auVar58._8_4_);
      auVar59._12_4_ = -(uint)(-fVar151 <= auVar58._12_4_);
      auVar154 = auVar154 | auVar59;
      uVar39 = movmskps((int)uVar37,auVar154);
      uVar37 = (ulong)uVar39;
      if (uVar39 != 0) {
        auVar121._0_4_ = local_1018 * local_1048 - fVar126 * fVar136;
        auVar121._4_4_ = fStack_1014 * fStack_1044 - fVar128 * fVar138;
        auVar121._8_4_ = fStack_1010 * fStack_1040 - fVar129 * fVar139;
        auVar121._12_4_ = fStack_100c * fStack_103c - fVar130 * fVar140;
        auVar127._0_4_ = fVar126 * local_1068 - local_1058 * local_1048;
        auVar127._4_4_ = fVar128 * fStack_1064 - fStack_1054 * fStack_1044;
        auVar127._8_4_ = fVar129 * fStack_1060 - fStack_1050 * fStack_1040;
        auVar127._12_4_ = fVar130 * fStack_105c - fStack_104c * fStack_103c;
        uVar88 = (uint)DAT_01f46710;
        uVar94 = DAT_01f46710._4_4_;
        uVar96 = DAT_01f46710._8_4_;
        uVar98 = DAT_01f46710._12_4_;
        auVar60._4_4_ =
             -(uint)((float)((uint)(fVar128 * fVar138) & uVar94) <
                    (float)((uint)(fStack_1054 * fStack_1044) & uVar94));
        auVar60._0_4_ =
             -(uint)((float)((uint)(fVar126 * fVar136) & uVar88) <
                    (float)((uint)(local_1058 * local_1048) & uVar88));
        auVar60._8_4_ =
             -(uint)((float)((uint)(fVar129 * fVar139) & uVar96) <
                    (float)((uint)(fStack_1050 * fStack_1040) & uVar96));
        auVar60._12_4_ =
             -(uint)((float)((uint)(fVar130 * fVar140) & uVar98) <
                    (float)((uint)(fStack_104c * fStack_103c) & uVar98));
        local_1148 = blendvps(auVar127,auVar121,auVar60);
        auVar137._0_4_ = fVar163 * local_1048 - fVar99 * local_1068;
        auVar137._4_4_ = fVar104 * fStack_1044 - fVar103 * fStack_1064;
        auVar137._8_4_ = fVar106 * fStack_1040 - fVar105 * fStack_1060;
        auVar137._12_4_ = fVar108 * fStack_103c - fVar107 * fStack_105c;
        auVar61._4_4_ =
             -(uint)((float)((uint)(fVar133 * fStack_1044) & uVar94) <
                    (float)((uint)(fVar103 * fStack_1064) & uVar94));
        auVar61._0_4_ =
             -(uint)((float)((uint)(fVar131 * local_1048) & uVar88) <
                    (float)((uint)(fVar99 * local_1068) & uVar88));
        auVar61._8_4_ =
             -(uint)((float)((uint)(fVar134 * fStack_1040) & uVar96) <
                    (float)((uint)(fVar105 * fStack_1060) & uVar96));
        auVar61._12_4_ =
             -(uint)((float)((uint)(fVar135 * fStack_103c) & uVar98) <
                    (float)((uint)(fVar107 * fStack_105c) & uVar98));
        auVar29._4_4_ = fVar138 * fVar103 - fVar133 * fStack_1044;
        auVar29._0_4_ = fVar136 * fVar99 - fVar131 * local_1048;
        auVar29._8_4_ = fVar139 * fVar105 - fVar134 * fStack_1040;
        auVar29._12_4_ = fVar140 * fVar107 - fVar135 * fStack_103c;
        local_1138 = blendvps(auVar137,auVar29,auVar61);
        auVar125._0_4_ = fVar131 * fVar126 - fVar99 * local_1018;
        auVar125._4_4_ = fVar133 * fVar128 - fVar103 * fStack_1014;
        auVar125._8_4_ = fVar134 * fVar129 - fVar105 * fStack_1010;
        auVar125._12_4_ = fVar135 * fVar130 - fVar107 * fStack_100c;
        auVar132._0_4_ = fVar99 * local_1058 - fVar163 * fVar126;
        auVar132._4_4_ = fVar103 * fStack_1054 - fVar104 * fVar128;
        auVar132._8_4_ = fVar105 * fStack_1050 - fVar106 * fVar129;
        auVar132._12_4_ = fVar107 * fStack_104c - fVar108 * fVar130;
        auVar62._4_4_ =
             -(uint)((float)((uint)(fVar103 * fStack_1014) & uVar94) <
                    (float)((uint)(fVar104 * fVar128) & uVar94));
        auVar62._0_4_ =
             -(uint)((float)((uint)(fVar99 * local_1018) & uVar88) <
                    (float)((uint)(fVar163 * fVar126) & uVar88));
        auVar62._8_4_ =
             -(uint)((float)((uint)(fVar105 * fStack_1010) & uVar96) <
                    (float)((uint)(fVar106 * fVar129) & uVar96));
        auVar62._12_4_ =
             -(uint)((float)((uint)(fVar107 * fStack_100c) & uVar98) <
                    (float)((uint)(fVar108 * fVar130) & uVar98));
        local_1128 = blendvps(auVar132,auVar125,auVar62);
        fVar97 = fVar146 * local_1148._0_4_ +
                 fVar87 * local_1138._0_4_ + local_1038 * local_1128._0_4_;
        fVar157 = fVar146 * local_1148._4_4_ +
                  fVar87 * local_1138._4_4_ + local_1038 * local_1128._4_4_;
        fVar141 = fVar146 * local_1148._8_4_ +
                  fVar87 * local_1138._8_4_ + local_1038 * local_1128._8_4_;
        fVar87 = fVar146 * local_1148._12_4_ +
                 fVar87 * local_1138._12_4_ + local_1038 * local_1128._12_4_;
        auVar83._0_4_ = fVar97 + fVar97;
        auVar83._4_4_ = fVar157 + fVar157;
        auVar83._8_4_ = fVar141 + fVar141;
        auVar83._12_4_ = fVar87 + fVar87;
        auVar63._0_4_ = fVar147 * local_1138._0_4_ + fVar159 * local_1128._0_4_;
        auVar63._4_4_ = fVar148 * local_1138._4_4_ + fVar160 * local_1128._4_4_;
        auVar63._8_4_ = fVar149 * local_1138._8_4_ + fVar161 * local_1128._8_4_;
        auVar63._12_4_ = fVar150 * local_1138._12_4_ + fVar162 * local_1128._12_4_;
        fVar146 = local_1028 * local_1148._0_4_ + auVar63._0_4_;
        fVar151 = fStack_1024 * local_1148._4_4_ + auVar63._4_4_;
        fVar68 = fStack_1020 * local_1148._8_4_ + auVar63._8_4_;
        fVar69 = fStack_101c * local_1148._12_4_ + auVar63._12_4_;
        auVar58 = rcpps(auVar63,auVar83);
        fVar87 = auVar58._0_4_;
        fVar97 = auVar58._4_4_;
        fVar157 = auVar58._8_4_;
        fVar141 = auVar58._12_4_;
        fVar146 = ((1.0 - auVar83._0_4_ * fVar87) * fVar87 + fVar87) * (fVar146 + fVar146);
        fVar151 = ((1.0 - auVar83._4_4_ * fVar97) * fVar97 + fVar97) * (fVar151 + fVar151);
        fVar157 = ((1.0 - auVar83._8_4_ * fVar157) * fVar157 + fVar157) * (fVar68 + fVar68);
        fVar141 = ((1.0 - auVar83._12_4_ * fVar141) * fVar141 + fVar141) * (fVar69 + fVar69);
        fVar97 = *(float *)(ray + k * 4 + 0x80);
        fVar87 = *(float *)(ray + k * 4 + 0x30);
        auVar72._4_4_ = -(uint)(fVar87 <= fVar151);
        auVar72._0_4_ = -(uint)(fVar87 <= fVar146);
        auVar72._8_4_ = -(uint)(fVar87 <= fVar157);
        auVar72._12_4_ = -(uint)(fVar87 <= fVar141);
        auVar64._0_4_ = -(uint)(fVar146 <= fVar97 && fVar87 <= fVar146) & auVar154._0_4_;
        auVar64._4_4_ = -(uint)(fVar151 <= fVar97 && fVar87 <= fVar151) & auVar154._4_4_;
        auVar64._8_4_ = -(uint)(fVar157 <= fVar97 && fVar87 <= fVar157) & auVar154._8_4_;
        auVar64._12_4_ = -(uint)(fVar141 <= fVar97 && fVar87 <= fVar141) & auVar154._12_4_;
        uVar39 = movmskps(uVar39,auVar64);
        uVar37 = (ulong)uVar39;
        if (uVar39 != 0) {
          valid.field_0.i[0] = auVar64._0_4_ & -(uint)(auVar83._0_4_ != 0.0);
          valid.field_0.i[1] = auVar64._4_4_ & -(uint)(auVar83._4_4_ != 0.0);
          valid.field_0.i[2] = auVar64._8_4_ & -(uint)(auVar83._8_4_ != 0.0);
          valid.field_0.i[3] = auVar64._12_4_ & -(uint)(auVar83._12_4_ != 0.0);
          uVar39 = movmskps(uVar39,(undefined1  [16])valid.field_0);
          uVar37 = (ulong)uVar39;
          if (uVar39 != 0) {
            tNear.field_0.v[2] = local_1088._8_4_;
            tNear.field_0._0_8_ = local_1088._0_8_;
            tNear.field_0.v[3] = local_1088._12_4_;
            auVar32._4_4_ = fStack_1094;
            auVar32._0_4_ = local_1098;
            auVar32._8_4_ = fStack_1090;
            auVar32._12_4_ = fStack_108c;
            local_1158[0] = fVar146;
            local_1158[1] = fVar151;
            local_1158[2] = fVar157;
            local_1158[3] = fVar141;
            pSVar22 = context->scene;
            auVar58 = rcpps(auVar72,auVar32);
            fVar87 = auVar58._0_4_;
            fVar68 = auVar58._4_4_;
            fVar69 = auVar58._8_4_;
            fVar70 = auVar58._12_4_;
            fVar87 = (float)(-(uint)(1e-18 <= ABS(local_1098)) &
                            (uint)(((float)DAT_01f46a60 - local_1098 * fVar87) * fVar87 + fVar87));
            fVar68 = (float)(-(uint)(1e-18 <= ABS(fStack_1094)) &
                            (uint)((DAT_01f46a60._4_4_ - fStack_1094 * fVar68) * fVar68 + fVar68));
            fVar69 = (float)(-(uint)(1e-18 <= ABS(fStack_1090)) &
                            (uint)((DAT_01f46a60._8_4_ - fStack_1090 * fVar69) * fVar69 + fVar69));
            fVar70 = (float)(-(uint)(1e-18 <= ABS(fStack_108c)) &
                            (uint)((DAT_01f46a60._12_4_ - fStack_108c * fVar70) * fVar70 + fVar70));
            auVar122._0_4_ = fVar118 * fVar87;
            auVar122._4_4_ = fVar123 * fVar68;
            auVar122._8_4_ = local_1088._8_4_ * fVar69;
            auVar122._12_4_ = local_1088._12_4_ * fVar70;
            local_1178 = minps(auVar122,_DAT_01f46a60);
            auVar113._0_4_ = fVar87 * local_1078._0_4_;
            auVar113._4_4_ = fVar68 * local_1078._4_4_;
            auVar113._8_4_ = fVar69 * local_1078._8_4_;
            auVar113._12_4_ = fVar70 * local_1078._12_4_;
            local_1168 = minps(auVar113,_DAT_01f46a60);
            auVar30._4_4_ = fVar151;
            auVar30._0_4_ = fVar146;
            auVar30._8_4_ = fVar157;
            auVar30._12_4_ = fVar141;
            auVar79 = blendvps(_DAT_01f45a30,auVar30,(undefined1  [16])valid.field_0);
            auVar91._4_4_ = auVar79._0_4_;
            auVar91._0_4_ = auVar79._4_4_;
            auVar91._8_4_ = auVar79._12_4_;
            auVar91._12_4_ = auVar79._8_4_;
            auVar58 = minps(auVar91,auVar79);
            auVar73._0_8_ = auVar58._8_8_;
            auVar73._8_4_ = auVar58._0_4_;
            auVar73._12_4_ = auVar58._4_4_;
            auVar58 = minps(auVar73,auVar58);
            uVar39 = -(uint)(auVar58._0_4_ == auVar79._0_4_);
            uVar88 = -(uint)(auVar58._4_4_ == auVar79._4_4_);
            uVar94 = -(uint)(auVar58._8_4_ == auVar79._8_4_);
            uVar96 = -(uint)(auVar58._12_4_ == auVar79._12_4_);
            auVar86._4_4_ = uVar88;
            auVar86._0_4_ = uVar39;
            auVar84._0_4_ = uVar39 & valid.field_0.i[0];
            auVar84._4_4_ = uVar88 & valid.field_0.i[1];
            auVar84._8_4_ = uVar94 & valid.field_0.i[2];
            auVar84._12_4_ = uVar96 & valid.field_0.i[3];
            iVar34 = movmskps((int)pSVar22,auVar84);
            auVar85._8_4_ = 0xffffffff;
            auVar85._0_8_ = 0xffffffffffffffff;
            auVar85._12_4_ = 0xffffffff;
            if (iVar34 != 0) {
              auVar86._8_4_ = uVar94;
              auVar86._12_4_ = uVar96;
              auVar85 = auVar86;
            }
            pRVar40 = (RayQueryContext *)((long)&((NodeRefPtr<4> *)&pRVar40->scene)->ptr + uVar42);
            auVar65._0_4_ = valid.field_0.i[0] & auVar85._0_4_;
            auVar65._4_4_ = valid.field_0.i[1] & auVar85._4_4_;
            auVar65._8_4_ = valid.field_0.i[2] & auVar85._8_4_;
            auVar65._12_4_ = valid.field_0.i[3] & auVar85._12_4_;
            uVar35 = movmskps(iVar34,auVar65);
            uVar37 = CONCAT44((int)((ulong)pSVar22 >> 0x20),uVar35);
            lVar38 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
LAB_006f9e48:
            uVar39 = *(uint *)((long)&((NodeRefPtr<4> *)&pRVar40[0xc].scene)->ptr + lVar38 * 4);
            pGVar23 = (pSVar22->geometries).items[uVar39].ptr;
            if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar38] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar35 = *(undefined4 *)(local_1178 + lVar38 * 4);
                fVar87 = local_1158[lVar38 + -4];
                *(float *)(ray + k * 4 + 0x80) = local_1158[lVar38];
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1148 + lVar38 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1138 + lVar38 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1128 + lVar38 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar35;
                *(float *)(ray + k * 4 + 0x100) = fVar87;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&pRVar40[0xc].args + lVar38 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar39;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar39 = context->user->instPrimID[0];
                uVar37 = (ulong)uVar39;
                *(uint *)(ray + k * 4 + 0x140) = uVar39;
                pRVar40 = context;
                goto LAB_006fa34c;
              }
              local_fd8 = *(undefined4 *)(local_1178 + lVar38 * 4);
              local_fc8 = local_1158[lVar38 + -4];
              uVar35 = *(undefined4 *)(local_1148 + lVar38 * 4);
              uVar36 = *(undefined4 *)(local_1138 + lVar38 * 4);
              local_fa8._4_4_ = uVar39;
              local_fa8._0_4_ = uVar39;
              local_fa8._8_4_ = uVar39;
              local_fa8._12_4_ = uVar39;
              uVar19 = *(undefined4 *)((long)&pRVar40[0xc].args + lVar38 * 4);
              local_fb8._4_4_ = uVar19;
              local_fb8._0_4_ = uVar19;
              local_fb8._8_4_ = uVar19;
              local_fb8._12_4_ = uVar19;
              local_ff8._4_4_ = uVar36;
              local_ff8._0_4_ = uVar36;
              local_ff8._8_4_ = uVar36;
              local_ff8._12_4_ = uVar36;
              uVar36 = *(undefined4 *)(local_1128 + lVar38 * 4);
              local_fe8._4_4_ = uVar36;
              local_fe8._0_4_ = uVar36;
              local_fe8._8_4_ = uVar36;
              local_fe8._12_4_ = uVar36;
              local_1008[0] = (RTCHitN)(char)uVar35;
              local_1008[1] = (RTCHitN)(char)((uint)uVar35 >> 8);
              local_1008[2] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
              local_1008[3] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
              local_1008[4] = (RTCHitN)(char)uVar35;
              local_1008[5] = (RTCHitN)(char)((uint)uVar35 >> 8);
              local_1008[6] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
              local_1008[7] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
              local_1008[8] = (RTCHitN)(char)uVar35;
              local_1008[9] = (RTCHitN)(char)((uint)uVar35 >> 8);
              local_1008[10] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
              local_1008[0xb] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
              local_1008[0xc] = (RTCHitN)(char)uVar35;
              local_1008[0xd] = (RTCHitN)(char)((uint)uVar35 >> 8);
              local_1008[0xe] = (RTCHitN)(char)((uint)uVar35 >> 0x10);
              local_1008[0xf] = (RTCHitN)(char)((uint)uVar35 >> 0x18);
              uStack_fd4 = local_fd8;
              uStack_fd0 = local_fd8;
              uStack_fcc = local_fd8;
              fStack_fc4 = local_fc8;
              fStack_fc0 = local_fc8;
              fStack_fbc = local_fc8;
              local_f98 = context->user->instID[0];
              uStack_f94 = local_f98;
              uStack_f90 = local_f98;
              uStack_f8c = local_f98;
              local_f88 = context->user->instPrimID[0];
              uStack_f84 = local_f88;
              uStack_f80 = local_f88;
              uStack_f7c = local_f88;
              *(float *)(ray + k * 4 + 0x80) = local_1158[lVar38];
              local_1238 = *local_1228;
              args.valid = (int *)local_1238;
              args.geometryUserPtr = pGVar23->userPtr;
              args.context = context->user;
              args.hit = local_1008;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar23->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar23->intersectionFilterN)(&args);
              }
              if (local_1238 == (undefined1  [16])0x0) {
                auVar74._8_4_ = 0xffffffff;
                auVar74._0_8_ = 0xffffffffffffffff;
                auVar74._12_4_ = 0xffffffff;
                auVar74 = auVar74 ^ _DAT_01f46b70;
              }
              else {
                p_Var24 = context->args->filter;
                if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var24)(&args);
                }
                auVar66._0_4_ = -(uint)(local_1238._0_4_ == 0);
                auVar66._4_4_ = -(uint)(local_1238._4_4_ == 0);
                auVar66._8_4_ = -(uint)(local_1238._8_4_ == 0);
                auVar66._12_4_ = -(uint)(local_1238._12_4_ == 0);
                auVar74 = auVar66 ^ _DAT_01f46b70;
                if (local_1238 != (undefined1  [16])0x0) {
                  auVar58 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                  auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar66);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                }
              }
              if ((_DAT_01f46b40 & auVar74) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar97;
              }
              else {
                fVar97 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar38] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar146 <= fVar97) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar151 <= fVar97) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar157 <= fVar97) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar141 <= fVar97) & valid.field_0.i[3];
            }
            uVar35 = (undefined4)((ulong)lVar38 >> 0x20);
            iVar34 = movmskps((int)lVar38,(undefined1  [16])valid.field_0);
            uVar37 = CONCAT44(uVar35,iVar34);
            if (iVar34 == 0) goto LAB_006fa34c;
            auVar31._4_4_ = fVar151;
            auVar31._0_4_ = fVar146;
            auVar31._8_4_ = fVar157;
            auVar31._12_4_ = fVar141;
            auVar79 = blendvps(_DAT_01f45a30,auVar31,(undefined1  [16])valid.field_0);
            auVar92._4_4_ = auVar79._0_4_;
            auVar92._0_4_ = auVar79._4_4_;
            auVar92._8_4_ = auVar79._12_4_;
            auVar92._12_4_ = auVar79._8_4_;
            auVar58 = minps(auVar92,auVar79);
            auVar75._0_8_ = auVar58._8_8_;
            auVar75._8_4_ = auVar58._0_4_;
            auVar75._12_4_ = auVar58._4_4_;
            auVar58 = minps(auVar75,auVar58);
            auVar76._0_8_ =
                 CONCAT44(-(uint)(auVar58._4_4_ == auVar79._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar58._0_4_ == auVar79._0_4_) & valid.field_0._0_4_);
            auVar76._8_4_ = -(uint)(auVar58._8_4_ == auVar79._8_4_) & valid.field_0._8_4_;
            auVar76._12_4_ = -(uint)(auVar58._12_4_ == auVar79._12_4_) & valid.field_0._12_4_;
            iVar34 = movmskps(iVar34,auVar76);
            aVar67 = valid.field_0;
            if (iVar34 != 0) {
              aVar67.i[2] = auVar76._8_4_;
              aVar67._0_8_ = auVar76._0_8_;
              aVar67.i[3] = auVar76._12_4_;
            }
            uVar36 = movmskps(iVar34,(undefined1  [16])aVar67);
            uVar37 = CONCAT44(uVar35,uVar36);
            lVar38 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
            goto LAB_006f9e48;
          }
        }
      }
LAB_006fa34c:
      fVar141 = local_10d8;
      fVar68 = fStack_10d4;
      fVar69 = fStack_10d0;
      fVar70 = fStack_10cc;
      fVar146 = local_10e8;
      fVar71 = fStack_10e4;
      fVar77 = fStack_10e0;
      fVar78 = fStack_10dc;
      fVar158 = local_1108;
      fVar93 = fStack_1104;
      fVar95 = fStack_1100;
      fVar99 = fStack_10fc;
      fVar163 = local_1118;
      fVar103 = fStack_1114;
      fVar104 = fStack_1110;
      fVar105 = fStack_110c;
      fVar87 = local_10a8;
      fVar106 = fStack_10a4;
      fVar107 = fStack_10a0;
      fVar108 = fStack_109c;
      fVar97 = local_10b8;
      fVar109 = fStack_10b4;
      fVar114 = fStack_10b0;
      fVar115 = fStack_10ac;
      fVar157 = local_10c8;
      fVar116 = fStack_10c4;
      fVar118 = fStack_10c0;
      fVar123 = fStack_10bc;
      fVar151 = local_10f8;
      fVar126 = fStack_10f4;
      fVar128 = fStack_10f0;
      fVar129 = fStack_10ec;
    }
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar58._4_4_ = uVar35;
    auVar58._0_4_ = uVar35;
    auVar58._8_4_ = uVar35;
    auVar58._12_4_ = uVar35;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }